

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O2

char16 * __thiscall Js::ConcatStringMulti::GetSz(ConcatStringMulti *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  char16 *pcVar4;
  
  bVar2 = IsFilled(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                ,0x21e,"(IsFilled())","IsFilled()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pcVar4 = ConcatStringBase::GetSzImpl<Js::ConcatStringMulti>((ConcatStringBase *)this);
  memset(this + 1,0,(ulong)this->slotCount << 3);
  LiteralStringWithPropertyStringPtr::ConvertString<Js::ConcatStringMulti>(this);
  return pcVar4;
}

Assistant:

const char16 *
    ConcatStringMulti::GetSz()
    {
        Assert(IsFilled());
        const char16 * sz = GetSzImpl<ConcatStringMulti>();

        // Allow slots to be garbage collected if no more refs.
        ClearArray(m_slots, slotCount);

        LiteralStringWithPropertyStringPtr::ConvertString(this);
        return sz;
    }